

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O2

void restore_all_coding_context(AV1_COMP *cpi)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  int8_t iVar8;
  int8_t iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  MV_STATS *pMVar15;
  MV_STATS *pMVar16;
  byte bVar17;
  
  bVar17 = 0;
  uVar1 = *(undefined8 *)(cpi->coding_context).lf.filter_level;
  iVar12 = (cpi->coding_context).lf.filter_level_u;
  iVar13 = (cpi->coding_context).lf.filter_level_v;
  uVar2 = *(undefined8 *)(cpi->coding_context).lf.backup_filter_level;
  iVar10 = (cpi->coding_context).lf.backup_filter_level_u;
  iVar11 = (cpi->coding_context).lf.backup_filter_level_v;
  uVar6 = (cpi->coding_context).lf.mode_ref_delta_enabled;
  uVar7 = (cpi->coding_context).lf.mode_ref_delta_update;
  iVar8 = (cpi->coding_context).lf.ref_deltas[0];
  iVar9 = (cpi->coding_context).lf.ref_deltas[1];
  uVar3 = *(undefined8 *)((cpi->coding_context).lf.ref_deltas + 2);
  uVar4 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_strengths;
  uVar5 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 2);
  (cpi->common).lf.sharpness_level = (cpi->coding_context).lf.sharpness_level;
  (cpi->common).lf.mode_ref_delta_enabled = uVar6;
  (cpi->common).lf.mode_ref_delta_update = uVar7;
  (cpi->common).lf.ref_deltas[0] = iVar8;
  (cpi->common).lf.ref_deltas[1] = iVar9;
  *(undefined8 *)((cpi->common).lf.ref_deltas + 2) = uVar3;
  *(undefined8 *)(cpi->common).lf.backup_filter_level = uVar2;
  (cpi->common).lf.backup_filter_level_u = iVar10;
  (cpi->common).lf.backup_filter_level_v = iVar11;
  *(undefined8 *)(cpi->common).lf.filter_level = uVar1;
  (cpi->common).lf.filter_level_u = iVar12;
  (cpi->common).lf.filter_level_v = iVar13;
  (cpi->common).cdef_info.cdef_bits = (cpi->coding_context).cdef_info.cdef_bits;
  *(undefined8 *)(cpi->common).cdef_info.cdef_strengths = uVar4;
  *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 2) = uVar5;
  uVar1 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 6);
  *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 4) =
       *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 4);
  *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 6) = uVar1;
  uVar1 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 10);
  *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 8) =
       *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 8);
  *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 10) = uVar1;
  uVar1 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xe);
  *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xc) =
       *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xc);
  *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xe) = uVar1;
  uVar1 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 2);
  *(undefined8 *)(cpi->common).cdef_info.cdef_uv_strengths =
       *(undefined8 *)(cpi->coding_context).cdef_info.cdef_uv_strengths;
  *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 2) = uVar1;
  uVar1 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 6);
  *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 4) =
       *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 4);
  *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 6) = uVar1;
  uVar1 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 10);
  *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 8) =
       *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 8);
  *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 10) = uVar1;
  uVar1 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xe);
  *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xc) =
       *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xc);
  *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xe) = uVar1;
  iVar10 = (cpi->coding_context).cdef_info.nb_cdef_strengths;
  (cpi->common).cdef_info.cdef_damping = (cpi->coding_context).cdef_info.cdef_damping;
  (cpi->common).cdef_info.nb_cdef_strengths = iVar10;
  memcpy(&cpi->rc,&(cpi->coding_context).rc,0x140);
  pMVar15 = &(cpi->coding_context).mv_stats;
  pMVar16 = &cpi->ppi->mv_stats;
  for (lVar14 = 0x4c; lVar14 != 0; lVar14 = lVar14 + -1) {
    *(char *)&pMVar16->high_prec = (char)pMVar15->high_prec;
    pMVar15 = (MV_STATS *)((long)pMVar15 + (ulong)bVar17 * -2 + 1);
    pMVar16 = (MV_STATS *)((long)pMVar16 + (ulong)bVar17 * -2 + 1);
  }
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    release_scaled_references(cpi);
    return;
  }
  return;
}

Assistant:

static inline void restore_all_coding_context(AV1_COMP *cpi) {
  restore_extra_coding_context(cpi);
  if (!frame_is_intra_only(&cpi->common)) release_scaled_references(cpi);
}